

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall
duckdb::BaseAppender::AppendValueInternal<int,long>(BaseAppender *this,Vector *col,int input)

{
  long lVar1;
  
  lVar1 = Cast::Operation<int,long>(input);
  *(long *)(col->data + (this->chunk).count * 8) = lVar1;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}